

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

void doh_show(Curl_easy *data,dohentry *d)

{
  int iVar1;
  curl_trc_feat *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  long lVar8;
  uchar *puVar9;
  dohentry *s;
  ulong uVar10;
  size_t maxlength;
  byte bVar11;
  char buffer [128];
  char local_b8 [136];
  
  bVar11 = 0;
  if ((((data->set).field_0x897 & 0x40) != 0) &&
     ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
    Curl_infof(data,"[DoH] TTL: %u seconds",(ulong)d->ttl);
  }
  if (0 < d->numaddr) {
    puVar9 = d->addr[0].ip.v4 + 1;
    lVar8 = 0;
    do {
      iVar1 = d->addr[lVar8].type;
      if (iVar1 == 0x1c) {
        puVar7 = &DAT_0017a600;
        pcVar4 = local_b8;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)pcVar4 = *puVar7;
          puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
          pcVar4 = pcVar4 + (ulong)bVar11 * -0x10 + 8;
        }
        sVar3 = strlen(local_b8);
        pcVar4 = local_b8 + sVar3;
        maxlength = 0x80 - sVar3;
        uVar10 = 0xfffffffffffffffe;
        do {
          pcVar6 = ":";
          if (uVar10 == 0xfffffffffffffffe) {
            pcVar6 = "";
          }
          curl_msnprintf(pcVar4,maxlength,"%s%02x%02x",pcVar6,(ulong)puVar9[uVar10 + 1],
                         (ulong)puVar9[uVar10 + 2]);
          sVar3 = strlen(pcVar4);
          maxlength = maxlength - sVar3;
          pcVar4 = pcVar4 + sVar3;
          uVar10 = uVar10 + 2;
        } while (uVar10 < 0xe);
        if ((((data->set).field_0x897 & 0x40) != 0) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"%s",local_b8);
        }
      }
      else if (((iVar1 == 1) && (((data->set).field_0x897 & 0x40) != 0)) &&
              ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))) {
        Curl_infof(data,"[DoH] A: %u.%u.%u.%u",(ulong)d->addr[lVar8].ip.v4[0],
                   (ulong)d->addr[lVar8].ip.v4[1],(ulong)d->addr[lVar8].ip.v4[2],
                   (ulong)d->addr[lVar8].ip.v4[3]);
      }
      lVar8 = lVar8 + 1;
      puVar9 = puVar9 + 0x14;
    } while (lVar8 < d->numaddr);
  }
  if (0 < d->numcname) {
    lVar8 = 0;
    s = d;
    do {
      if ((((data->set).field_0x897 & 0x40) != 0) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        pcVar4 = Curl_dyn_ptr(s->cname);
        Curl_infof(data,"CNAME: %s",pcVar4);
      }
      lVar8 = lVar8 + 1;
      s = (dohentry *)(s->cname + 1);
    } while (lVar8 < d->numcname);
  }
  return;
}

Assistant:

static void doh_show(struct Curl_easy *data,
                     const struct dohentry *d)
{
  int i;
  infof(data, "[DoH] TTL: %u seconds", d->ttl);
  for(i = 0; i < d->numaddr; i++) {
    const struct dohaddr *a = &d->addr[i];
    if(a->type == DNS_TYPE_A) {
      infof(data, "[DoH] A: %u.%u.%u.%u",
            a->ip.v4[0], a->ip.v4[1],
            a->ip.v4[2], a->ip.v4[3]);
    }
    else if(a->type == DNS_TYPE_AAAA) {
      int j;
      char buffer[128] = "[DoH] AAAA: ";
      size_t len = strlen(buffer);
      char *ptr = &buffer[len];
      len = sizeof(buffer) - len;
      for(j = 0; j < 16; j += 2) {
        size_t l;
        msnprintf(ptr, len, "%s%02x%02x", j ? ":" : "", d->addr[i].ip.v6[j],
                  d->addr[i].ip.v6[j + 1]);
        l = strlen(ptr);
        len -= l;
        ptr += l;
      }
      infof(data, "%s", buffer);
    }
  }
#ifdef USE_HTTPSRR
  for(i = 0; i < d->numhttps_rrs; i++) {
# ifdef DEBUGBUILD
    doh_print_buf(data, "DoH HTTPS",
                  d->https_rrs[i].val, d->https_rrs[i].len);
# else
    infof(data, "DoH HTTPS RR: length %d", d->https_rrs[i].len);
# endif
  }
#endif
  for(i = 0; i < d->numcname; i++) {
    infof(data, "CNAME: %s", Curl_dyn_ptr(&d->cname[i]));
  }
}